

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleTypeHandler<6UL>::SimpleTypeHandler
          (SimpleTypeHandler<6UL> *this,SimpleTypeHandler<6UL> *typeHandler)

{
  undefined8 *puVar1;
  PropertyRecord *pPVar2;
  code *pcVar3;
  Type TVar4;
  bool bVar5;
  long lVar6;
  undefined4 *puVar7;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar8;
  Type *addr;
  
  (this->super_DynamicTypeHandler).propertyTypes =
       (typeHandler->super_DynamicTypeHandler).propertyTypes;
  (this->super_DynamicTypeHandler).flags = (typeHandler->super_DynamicTypeHandler).flags;
  (this->super_DynamicTypeHandler).offsetOfInlineSlots =
       (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots;
  (this->super_DynamicTypeHandler).slotCapacity =
       (typeHandler->super_DynamicTypeHandler).slotCapacity;
  TVar4 = (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity;
  (this->super_DynamicTypeHandler).unusedBytes = (typeHandler->super_DynamicTypeHandler).unusedBytes
  ;
  (this->super_DynamicTypeHandler).inlineSlotCapacity = TVar4;
  (this->super_DynamicTypeHandler).protoCachesWereInvalidated = false;
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_015413a0
  ;
  lVar6 = 0x28;
  do {
    puVar1 = (undefined8 *)((long)this->descriptors + lVar6 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined1 *)
     ((long)&(((SimpleTypeHandler<6UL> *)(this->descriptors + -2))->super_DynamicTypeHandler).
             _vptr_DynamicTypeHandler + lVar6) = 7;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x88);
  if (((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x1d,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (0 < this->propertyCount) {
    addr = this->descriptors;
    paVar8 = &typeHandler->descriptors[0].field_1;
    lVar6 = 0;
    do {
      pPVar2 = (((Type *)(paVar8 + -1))->Id).ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      (addr->Id).ptr = pPVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      addr->field_1 = *paVar8;
      lVar6 = lVar6 + 1;
      addr = addr + 1;
      paVar8 = paVar8 + 2;
    } while (lVar6 < this->propertyCount);
  }
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(SimpleTypeHandler<size> * typeHandler) :
        DynamicTypeHandler(typeHandler)
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();
        for (int i = 0; i < propertyCount; i++)
        {
            descriptors[i] = typeHandler->descriptors[i];
        }
    }